

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void __thiscall
embree::sse42::
BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::ObjectIntersectorK<4,_true>_>,_false>
::intersect(BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::ObjectIntersectorK<4,_true>_>,_false>
            *this,vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,RayQueryContext *context)

{
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  uint uVar16;
  code *pcVar17;
  undefined4 uVar18;
  ulong uVar19;
  RayQueryContext *pRVar20;
  int iVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  RayQueryContext *pRVar25;
  RayQueryContext *pRVar26;
  AABBNodeMB4D *node1;
  ulong uVar27;
  NodeRef *pNVar28;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar29;
  vfloat_impl<4> __tmp;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar41;
  vfloat_impl<4> __tmp_1;
  undefined1 auVar39 [16];
  float fVar42;
  undefined1 auVar40 [16];
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar53;
  float fVar54;
  vint4 ai;
  float fVar55;
  undefined1 auVar48 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar49;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar56;
  float fVar57;
  float fVar59;
  float fVar61;
  vint4 ai_1;
  float fVar60;
  float fVar62;
  float fVar63;
  float fVar64;
  undefined1 auVar58 [16];
  float fVar65;
  float fVar67;
  float fVar68;
  vint4 ai_3;
  undefined1 auVar66 [16];
  float fVar69;
  float fVar70;
  float fVar72;
  float fVar73;
  vint4 bi;
  undefined1 auVar71 [16];
  float fVar74;
  float fVar75;
  float fVar77;
  float fVar78;
  vint4 bi_3;
  undefined1 auVar76 [16];
  float fVar79;
  float fVar80;
  float fVar83;
  float fVar84;
  float fVar85;
  vint4 bi_1;
  float fVar86;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar87;
  uint uVar88;
  float fVar91;
  uint uVar93;
  vint4 ai_2;
  float fVar94;
  undefined1 auVar89 [16];
  uint uVar92;
  uint uVar95;
  undefined1 auVar90 [16];
  uint uVar96;
  uint uVar98;
  uint uVar99;
  vint4 bi_2;
  undefined1 auVar97 [16];
  uint uVar100;
  float fVar102;
  undefined1 auVar101 [16];
  float fVar103;
  float fVar104;
  float fVar106;
  float fVar107;
  undefined1 in_XMM12 [16];
  undefined1 auVar105 [16];
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  undefined1 in_XMM13 [16];
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  undefined1 in_XMM14 [16];
  float fVar116;
  undefined1 auVar117 [16];
  undefined1 local_17f8 [8];
  float fStack_17f0;
  float fStack_17ec;
  undefined1 local_17b8 [16];
  vint<4> *local_17a0;
  undefined8 local_1798;
  undefined4 local_1790;
  undefined8 local_1788;
  Intersectors *local_1780;
  undefined4 local_1778;
  uint local_1774;
  long local_1770;
  undefined8 local_1768;
  long local_1760;
  float local_1758;
  float fStack_1754;
  float fStack_1750;
  float fStack_174c;
  float local_1748;
  float fStack_1744;
  float fStack_1740;
  float fStack_173c;
  float local_1738;
  float fStack_1734;
  float fStack_1730;
  float fStack_172c;
  float local_1728;
  float fStack_1724;
  float fStack_1720;
  float fStack_171c;
  float local_1718;
  float fStack_1714;
  float fStack_1710;
  float fStack_170c;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1708;
  undefined8 local_16f8;
  undefined8 uStack_16f0;
  vint<4> mask;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  stack_node[1].ptr = *(size_t *)((valid_i->field_0).v[0] + 0x70);
  if (stack_node[1].ptr != 8) {
    auVar35._8_4_ = 0xffffffff;
    auVar35._0_8_ = 0xffffffffffffffff;
    auVar35._12_4_ = 0xffffffff;
    auVar66._0_4_ = -(uint)(*(int *)this == -1);
    auVar66._4_4_ = -(uint)(*(int *)(this + 4) == -1);
    auVar66._8_4_ = -(uint)(*(int *)(this + 8) == -1);
    auVar66._12_4_ = -(uint)(*(int *)(this + 0xc) == -1);
    iVar21 = movmskps((int)valid_i,auVar66);
    uVar22 = CONCAT44((int)((ulong)valid_i >> 0x20),iVar21);
    if (iVar21 != 0) {
      auVar82._0_8_ = (This->intersector4).intersect;
      auVar82._8_8_ = (This->intersector4).occluded;
      fVar83 = (float)((ulong)auVar82._0_8_ >> 0x20);
      fVar86 = (float)((ulong)auVar82._8_8_ >> 0x20);
      fVar56 = (float)DAT_01f4bd50;
      fVar59 = DAT_01f4bd50._4_4_;
      fVar61 = DAT_01f4bd50._8_4_;
      fVar63 = DAT_01f4bd50._12_4_;
      auVar71._4_4_ = -(uint)(ABS(fVar83) < fVar59);
      auVar71._0_4_ = -(uint)(ABS((float)auVar82._0_8_) < fVar56);
      auVar71._8_4_ = -(uint)(ABS((float)auVar82._8_8_) < fVar61);
      auVar71._12_4_ = -(uint)(ABS(fVar86) < fVar63);
      auVar71 = blendvps(auVar82,_DAT_01f4bd50,auVar71);
      auVar3 = *(undefined1 (*) [16])&(This->intersector4).name;
      auVar97._4_4_ = -(uint)(ABS(auVar3._4_4_) < fVar59);
      auVar97._0_4_ = -(uint)(ABS(auVar3._0_4_) < fVar56);
      auVar97._8_4_ = -(uint)(ABS(auVar3._8_4_) < fVar61);
      auVar97._12_4_ = -(uint)(ABS(auVar3._12_4_) < fVar63);
      auVar97 = blendvps(auVar3,_DAT_01f4bd50,auVar97);
      auVar4._0_8_ = (This->intersector4_filter).occluded;
      auVar4._8_8_ = (This->intersector4_filter).name;
      fVar91 = (float)((ulong)auVar4._0_8_ >> 0x20);
      fVar94 = (float)((ulong)auVar4._8_8_ >> 0x20);
      auVar101._4_4_ = -(uint)(ABS(fVar91) < fVar59);
      auVar101._0_4_ = -(uint)(ABS((float)auVar4._0_8_) < fVar56);
      auVar101._8_4_ = -(uint)(ABS((float)auVar4._8_8_) < fVar61);
      auVar101._12_4_ = -(uint)(ABS(fVar94) < fVar63);
      auVar101 = blendvps(auVar4,_DAT_01f4bd50,auVar101);
      auVar105 = rcpps(in_XMM12,auVar71);
      fVar104 = auVar105._0_4_;
      fVar106 = auVar105._4_4_;
      fVar107 = auVar105._8_4_;
      fVar108 = auVar105._12_4_;
      auVar105 = rcpps(in_XMM13,auVar97);
      fVar109 = auVar105._0_4_;
      fVar110 = auVar105._4_4_;
      fVar111 = auVar105._8_4_;
      fVar112 = auVar105._12_4_;
      auVar105 = rcpps(in_XMM14,auVar101);
      fVar113 = auVar105._0_4_;
      fVar114 = auVar105._4_4_;
      fVar115 = auVar105._8_4_;
      fVar116 = auVar105._12_4_;
      auVar105._0_12_ = ZEXT812(0);
      auVar105._12_4_ = 0;
      auVar81._0_8_ =
           CONCAT44(-(uint)(fVar83 < 0.0),-(uint)((float)auVar82._0_8_ < 0.0)) & 0x100000001;
      auVar81._8_4_ = -(uint)((float)auVar82._8_8_ < 0.0) & 1;
      auVar81._12_4_ = -(uint)(fVar86 < 0.0) & 1;
      auVar76._0_8_ =
           CONCAT44(-(uint)(auVar3._4_4_ < 0.0),-(uint)(auVar3._0_4_ < 0.0)) & 0x200000002;
      auVar76._8_4_ = -(uint)(auVar3._8_4_ < 0.0) & 2;
      auVar76._12_4_ = -(uint)(auVar3._12_4_ < 0.0) & 2;
      auVar82 = maxps(*(undefined1 (*) [16])&(This->intersector4_nofilter).name,auVar105);
      fVar83 = *(float *)&This->ptr;
      fVar86 = *(float *)((long)&This->ptr + 4);
      fVar102 = *(float *)&This->leafIntersector;
      fVar103 = *(float *)((long)&This->leafIntersector + 4);
      fVar56 = *(float *)&(This->collider).collide;
      fVar59 = *(float *)((long)&(This->collider).collide + 4);
      fVar61 = *(float *)&(This->collider).name;
      fVar63 = *(float *)((long)&(This->collider).name + 4);
      auVar89._0_8_ =
           CONCAT44(-(uint)(fVar91 < 0.0),-(uint)((float)auVar4._0_8_ < 0.0)) & 0x400000004;
      auVar89._8_4_ = -(uint)((float)auVar4._8_8_ < 0.0) & 4;
      auVar89._12_4_ = -(uint)(fVar94 < 0.0) & 4;
      local_16f8 = (This->intersector1).intersect;
      uStack_16f0 = (This->intersector1).occluded;
      local_17b8 = auVar66 ^ auVar35 | auVar89 | auVar76 | auVar81;
      auVar3._0_8_ = (This->intersector1).pointQuery;
      auVar3._8_8_ = (This->intersector1).name;
      do {
        lVar23 = 0;
        if (uVar22 != 0) {
          for (; (uVar22 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
          }
        }
        iVar21 = *(int *)(local_17b8 + lVar23 * 4);
        auVar30._0_4_ = -(uint)(iVar21 == local_17b8._0_4_);
        auVar30._4_4_ = -(uint)(iVar21 == local_17b8._4_4_);
        auVar30._8_4_ = -(uint)(iVar21 == local_17b8._8_4_);
        auVar30._12_4_ = -(uint)(iVar21 == local_17b8._12_4_);
        uVar18 = movmskps((int)lVar23,auVar30);
        uVar19 = ~CONCAT44((int)((ulong)lVar23 >> 0x20),uVar18);
        auVar117._8_8_ = uVar19;
        auVar117._0_8_ = stack_node[1].ptr;
        uVar22 = uVar22 & uVar19;
      } while (uVar22 != 0);
      local_17b8._8_4_ = 0xffffffff;
      local_17b8._0_8_ = 0xffffffffffffffff;
      local_17b8._12_4_ = 0xffffffff;
      auVar39._0_4_ = -(uint)(*(int *)this == -1);
      auVar39._4_4_ = -(uint)(*(int *)(this + 4) == -1);
      auVar39._8_4_ = -(uint)(*(int *)(this + 8) == -1);
      auVar39._12_4_ = -(uint)(*(int *)(this + 0xc) == -1);
      auVar66 = maxps(auVar3,ZEXT816(0));
      local_1708.v = (__m128)blendvps(_DAT_01f45a30,auVar66,auVar39);
      fVar104 = fVar104 + (1.0 - auVar71._0_4_ * fVar104) * fVar104;
      fVar106 = fVar106 + (1.0 - auVar71._4_4_ * fVar106) * fVar106;
      fVar107 = fVar107 + (1.0 - auVar71._8_4_ * fVar107) * fVar107;
      fVar108 = fVar108 + (1.0 - auVar71._12_4_ * fVar108) * fVar108;
      fVar109 = fVar109 + (1.0 - auVar97._0_4_ * fVar109) * fVar109;
      fVar110 = fVar110 + (1.0 - auVar97._4_4_ * fVar110) * fVar110;
      fVar111 = fVar111 + (1.0 - auVar97._8_4_ * fVar111) * fVar111;
      fVar112 = fVar112 + (1.0 - auVar97._12_4_ * fVar112) * fVar112;
      _local_17f8 = blendvps(_DAT_01f45a40,auVar82,auVar39);
      fVar113 = fVar113 + (1.0 - auVar101._0_4_ * fVar113) * fVar113;
      fVar114 = fVar114 + (1.0 - auVar101._4_4_ * fVar114) * fVar114;
      fVar115 = fVar115 + (1.0 - auVar101._8_4_ * fVar115) * fVar115;
      fVar116 = fVar116 + (1.0 - auVar101._12_4_ * fVar116) * fVar116;
      pNVar28 = stack_node + 2;
      paVar29 = &stack_near[2].field_0;
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_near[0].field_0 = _DAT_01f45a30;
      stack_near[1].field_0 = local_1708;
      local_1718 = fVar104;
      fStack_1714 = fVar106;
      fStack_1710 = fVar107;
      fStack_170c = fVar108;
      local_1728 = fVar109;
      fStack_1724 = fVar110;
      fStack_1720 = fVar111;
      fStack_171c = fVar112;
      local_1738 = fVar113;
      fStack_1734 = fVar114;
      fStack_1730 = fVar115;
      fStack_172c = fVar116;
      local_1748 = fVar83;
      fStack_1744 = fVar86;
      fStack_1740 = fVar102;
      fStack_173c = fVar103;
      local_1758 = fVar56;
      fStack_1754 = fVar59;
      fStack_1750 = fVar61;
      fStack_174c = fVar63;
LAB_006da087:
      uVar22 = auVar117._8_8_;
      pRVar20 = (RayQueryContext *)pNVar28[-1].ptr;
      if (pRVar20 != (RayQueryContext *)0xfffffffffffffff8) {
        pNVar28 = pNVar28 + -1;
        paVar1 = paVar29 + -1;
        pfVar9 = (float *)((long)paVar29 + -0xc);
        pfVar10 = (float *)((long)paVar29 + -8);
        pfVar11 = (float *)((long)paVar29 + -4);
        paVar29 = paVar29 + -1;
        auVar31._4_4_ = -(uint)(*pfVar9 < (float)local_17f8._4_4_);
        auVar31._0_4_ = -(uint)(paVar1->v[0] < (float)local_17f8._0_4_);
        auVar31._8_4_ = -(uint)(*pfVar10 < fStack_17f0);
        auVar31._12_4_ = -(uint)(*pfVar11 < fStack_17ec);
        uVar16 = movmskps(auVar117._0_4_,auVar31);
        uVar19 = CONCAT44(0,uVar16);
        auVar117._8_8_ = uVar22;
        auVar117._0_8_ = uVar19;
        fVar91 = paVar1->v[0];
        fVar94 = *pfVar9;
        fVar41 = *pfVar10;
        fVar42 = *pfVar11;
        if (uVar16 != 0) {
          while (((ulong)pRVar20 & 8) == 0) {
            uVar27 = (ulong)pRVar20 & 0xfffffffffffffff0;
            uVar16 = (uint)pRVar20 & 7;
            uVar22 = (ulong)uVar16;
            fVar43 = INFINITY;
            fVar44 = INFINITY;
            fVar45 = INFINITY;
            fVar46 = INFINITY;
            uVar19 = 0;
            pRVar20 = (RayQueryContext *)0x8;
            for (lVar23 = -0x10;
                (auVar117._8_4_ = uVar16, auVar117._0_8_ = uVar19, auVar117._12_4_ = 0, lVar23 != 0
                && (pRVar26 = *(RayQueryContext **)(uVar27 + 0x20 + lVar23 * 2),
                   pRVar26 != (RayQueryContext *)0x8)); lVar23 = lVar23 + 4) {
              fVar55 = *(float *)(uVar27 + 0x90 + lVar23);
              fVar57 = *(float *)(uVar27 + 0x30 + lVar23);
              fVar74 = *(float *)(uVar27 + 0x40 + lVar23);
              fVar64 = *(float *)(uVar27 + 0x50 + lVar23);
              fVar75 = *(float *)(uVar27 + 0x60 + lVar23);
              fVar12 = *(float *)&(This->intersector4_nofilter).intersect;
              fVar13 = *(float *)((long)&(This->intersector4_nofilter).intersect + 4);
              fVar14 = *(float *)&(This->intersector4_nofilter).occluded;
              fVar15 = *(float *)((long)&(This->intersector4_nofilter).occluded + 4);
              fVar65 = *(float *)(uVar27 + 0xb0 + lVar23);
              fVar69 = *(float *)(uVar27 + 0xd0 + lVar23);
              fVar70 = *(float *)(uVar27 + 0x70 + lVar23);
              fVar77 = *(float *)(uVar27 + 0xa0 + lVar23);
              fVar78 = *(float *)(uVar27 + 0xc0 + lVar23);
              fVar79 = *(float *)(uVar27 + 0xe0 + lVar23);
              fVar2 = *(float *)(uVar27 + 0x80 + lVar23);
              fVar47 = ((fVar55 * fVar12 + fVar57) - fVar83) * fVar104;
              fVar53 = ((fVar55 * fVar13 + fVar57) - fVar86) * fVar106;
              fVar54 = ((fVar55 * fVar14 + fVar57) - fVar102) * fVar107;
              fVar55 = ((fVar55 * fVar15 + fVar57) - fVar103) * fVar108;
              fVar57 = ((fVar65 * fVar12 + fVar64) - fVar56) * fVar109;
              fVar60 = ((fVar65 * fVar13 + fVar64) - fVar59) * fVar110;
              fVar62 = ((fVar65 * fVar14 + fVar64) - fVar61) * fVar111;
              fVar64 = ((fVar65 * fVar15 + fVar64) - fVar63) * fVar112;
              fVar65 = ((fVar69 * fVar12 + fVar70) - (float)local_16f8) * fVar113;
              fVar67 = ((fVar69 * fVar13 + fVar70) - local_16f8._4_4_) * fVar114;
              fVar68 = ((fVar69 * fVar14 + fVar70) - (float)uStack_16f0) * fVar115;
              fVar69 = ((fVar69 * fVar15 + fVar70) - uStack_16f0._4_4_) * fVar116;
              fVar70 = ((fVar77 * fVar12 + fVar74) - fVar83) * fVar104;
              fVar72 = ((fVar77 * fVar13 + fVar74) - fVar86) * fVar106;
              fVar73 = ((fVar77 * fVar14 + fVar74) - fVar102) * fVar107;
              fVar74 = ((fVar77 * fVar15 + fVar74) - fVar103) * fVar108;
              fVar80 = ((fVar78 * fVar12 + fVar75) - fVar56) * fVar109;
              fVar84 = ((fVar78 * fVar13 + fVar75) - fVar59) * fVar110;
              fVar85 = ((fVar78 * fVar14 + fVar75) - fVar61) * fVar111;
              fVar87 = ((fVar78 * fVar15 + fVar75) - fVar63) * fVar112;
              fVar75 = ((fVar79 * fVar12 + fVar2) - (float)local_16f8) * fVar113;
              fVar77 = ((fVar79 * fVar13 + fVar2) - local_16f8._4_4_) * fVar114;
              fVar78 = ((fVar79 * fVar14 + fVar2) - (float)uStack_16f0) * fVar115;
              fVar79 = ((fVar79 * fVar15 + fVar2) - uStack_16f0._4_4_) * fVar116;
              uVar88 = (uint)((int)fVar70 < (int)fVar47) * (int)fVar70 |
                       (uint)((int)fVar70 >= (int)fVar47) * (int)fVar47;
              uVar92 = (uint)((int)fVar72 < (int)fVar53) * (int)fVar72 |
                       (uint)((int)fVar72 >= (int)fVar53) * (int)fVar53;
              uVar93 = (uint)((int)fVar73 < (int)fVar54) * (int)fVar73 |
                       (uint)((int)fVar73 >= (int)fVar54) * (int)fVar54;
              uVar95 = (uint)((int)fVar74 < (int)fVar55) * (int)fVar74 |
                       (uint)((int)fVar74 >= (int)fVar55) * (int)fVar55;
              uVar96 = (uint)((int)fVar80 < (int)fVar57) * (int)fVar80 |
                       (uint)((int)fVar80 >= (int)fVar57) * (int)fVar57;
              uVar98 = (uint)((int)fVar84 < (int)fVar60) * (int)fVar84 |
                       (uint)((int)fVar84 >= (int)fVar60) * (int)fVar60;
              uVar99 = (uint)((int)fVar85 < (int)fVar62) * (int)fVar85 |
                       (uint)((int)fVar85 >= (int)fVar62) * (int)fVar62;
              uVar100 = (uint)((int)fVar87 < (int)fVar64) * (int)fVar87 |
                        (uint)((int)fVar87 >= (int)fVar64) * (int)fVar64;
              uVar96 = ((int)uVar96 < (int)uVar88) * uVar88 | ((int)uVar96 >= (int)uVar88) * uVar96;
              uVar98 = ((int)uVar98 < (int)uVar92) * uVar92 | ((int)uVar98 >= (int)uVar92) * uVar98;
              uVar99 = ((int)uVar99 < (int)uVar93) * uVar93 | ((int)uVar99 >= (int)uVar93) * uVar99;
              uVar100 = ((int)uVar100 < (int)uVar95) * uVar95 |
                        ((int)uVar100 >= (int)uVar95) * uVar100;
              uVar88 = (uint)((int)fVar75 < (int)fVar65) * (int)fVar75 |
                       (uint)((int)fVar75 >= (int)fVar65) * (int)fVar65;
              uVar92 = (uint)((int)fVar77 < (int)fVar67) * (int)fVar77 |
                       (uint)((int)fVar77 >= (int)fVar67) * (int)fVar67;
              uVar93 = (uint)((int)fVar78 < (int)fVar68) * (int)fVar78 |
                       (uint)((int)fVar78 >= (int)fVar68) * (int)fVar68;
              uVar95 = (uint)((int)fVar79 < (int)fVar69) * (int)fVar79 |
                       (uint)((int)fVar79 >= (int)fVar69) * (int)fVar69;
              auVar90._0_4_ =
                   ((int)uVar88 < (int)uVar96) * uVar96 | ((int)uVar88 >= (int)uVar96) * uVar88;
              auVar90._4_4_ =
                   ((int)uVar92 < (int)uVar98) * uVar98 | ((int)uVar92 >= (int)uVar98) * uVar92;
              auVar90._8_4_ =
                   ((int)uVar93 < (int)uVar99) * uVar99 | ((int)uVar93 >= (int)uVar99) * uVar93;
              auVar90._12_4_ =
                   ((int)uVar95 < (int)uVar100) * uVar100 | ((int)uVar95 >= (int)uVar100) * uVar95;
              uVar88 = (uint)((int)fVar70 < (int)fVar47) * (int)fVar47 |
                       (uint)((int)fVar70 >= (int)fVar47) * (int)fVar70;
              uVar92 = (uint)((int)fVar72 < (int)fVar53) * (int)fVar53 |
                       (uint)((int)fVar72 >= (int)fVar53) * (int)fVar72;
              uVar93 = (uint)((int)fVar73 < (int)fVar54) * (int)fVar54 |
                       (uint)((int)fVar73 >= (int)fVar54) * (int)fVar73;
              uVar95 = (uint)((int)fVar74 < (int)fVar55) * (int)fVar55 |
                       (uint)((int)fVar74 >= (int)fVar55) * (int)fVar74;
              uVar96 = (uint)((int)fVar80 < (int)fVar57) * (int)fVar57 |
                       (uint)((int)fVar80 >= (int)fVar57) * (int)fVar80;
              uVar98 = (uint)((int)fVar84 < (int)fVar60) * (int)fVar60 |
                       (uint)((int)fVar84 >= (int)fVar60) * (int)fVar84;
              uVar99 = (uint)((int)fVar85 < (int)fVar62) * (int)fVar62 |
                       (uint)((int)fVar85 >= (int)fVar62) * (int)fVar85;
              uVar100 = (uint)((int)fVar87 < (int)fVar64) * (int)fVar64 |
                        (uint)((int)fVar87 >= (int)fVar64) * (int)fVar87;
              uVar96 = ((int)uVar88 < (int)uVar96) * uVar88 | ((int)uVar88 >= (int)uVar96) * uVar96;
              uVar98 = ((int)uVar92 < (int)uVar98) * uVar92 | ((int)uVar92 >= (int)uVar98) * uVar98;
              uVar99 = ((int)uVar93 < (int)uVar99) * uVar93 | ((int)uVar93 >= (int)uVar99) * uVar99;
              uVar100 = ((int)uVar95 < (int)uVar100) * uVar95 |
                        ((int)uVar95 >= (int)uVar100) * uVar100;
              uVar88 = (uint)((int)fVar75 < (int)fVar65) * (int)fVar65 |
                       (uint)((int)fVar75 >= (int)fVar65) * (int)fVar75;
              uVar92 = (uint)((int)fVar77 < (int)fVar67) * (int)fVar67 |
                       (uint)((int)fVar77 >= (int)fVar67) * (int)fVar77;
              uVar93 = (uint)((int)fVar78 < (int)fVar68) * (int)fVar68 |
                       (uint)((int)fVar78 >= (int)fVar68) * (int)fVar78;
              uVar95 = (uint)((int)fVar79 < (int)fVar69) * (int)fVar69 |
                       (uint)((int)fVar79 >= (int)fVar69) * (int)fVar79;
              uVar88 = (uint)((int)local_17f8._0_4_ < (int)uVar88) * local_17f8._0_4_ |
                       ((int)local_17f8._0_4_ >= (int)uVar88) * uVar88;
              uVar92 = (uint)((int)local_17f8._4_4_ < (int)uVar92) * local_17f8._4_4_ |
                       ((int)local_17f8._4_4_ >= (int)uVar92) * uVar92;
              uVar93 = (uint)((int)fStack_17f0 < (int)uVar93) * (int)fStack_17f0 |
                       ((int)fStack_17f0 >= (int)uVar93) * uVar93;
              uVar95 = (uint)((int)fStack_17ec < (int)uVar95) * (int)fStack_17ec |
                       ((int)fStack_17ec >= (int)uVar95) * uVar95;
              bVar5 = (float)((uint)((int)auVar90._0_4_ < (int)local_1708._0_4_) * local_1708._0_4_
                             | ((int)auVar90._0_4_ >= (int)local_1708._0_4_) * auVar90._0_4_) <=
                      (float)(((int)uVar96 < (int)uVar88) * uVar96 |
                             ((int)uVar96 >= (int)uVar88) * uVar88);
              bVar6 = (float)((uint)((int)auVar90._4_4_ < (int)local_1708._4_4_) * local_1708._4_4_
                             | ((int)auVar90._4_4_ >= (int)local_1708._4_4_) * auVar90._4_4_) <=
                      (float)(((int)uVar98 < (int)uVar92) * uVar98 |
                             ((int)uVar98 >= (int)uVar92) * uVar92);
              bVar7 = (float)((uint)((int)auVar90._8_4_ < (int)local_1708._8_4_) * local_1708._8_4_
                             | ((int)auVar90._8_4_ >= (int)local_1708._8_4_) * auVar90._8_4_) <=
                      (float)(((int)uVar99 < (int)uVar93) * uVar99 |
                             ((int)uVar99 >= (int)uVar93) * uVar93);
              bVar8 = (float)((uint)((int)auVar90._12_4_ < (int)local_1708._12_4_) *
                              local_1708._12_4_ |
                             ((int)auVar90._12_4_ >= (int)local_1708._12_4_) * auVar90._12_4_) <=
                      (float)(((int)uVar100 < (int)uVar95) * uVar100 |
                             ((int)uVar100 >= (int)uVar95) * uVar95);
              auVar48._4_4_ = -(uint)bVar6;
              auVar48._0_4_ = -(uint)bVar5;
              auVar48._8_4_ = -(uint)bVar7;
              auVar48._12_4_ = -(uint)bVar8;
              if (uVar16 == 6) {
                fVar55 = *(float *)(uVar27 + 0xf0 + lVar23);
                fVar57 = *(float *)(uVar27 + 0x100 + lVar23);
                auVar48._0_4_ = -(uint)((fVar12 < fVar57 && fVar55 <= fVar12) && bVar5);
                auVar48._4_4_ = -(uint)((fVar13 < fVar57 && fVar55 <= fVar13) && bVar6);
                auVar48._8_4_ = -(uint)((fVar14 < fVar57 && fVar55 <= fVar14) && bVar7);
                auVar48._12_4_ = -(uint)((fVar15 < fVar57 && fVar55 <= fVar15) && bVar8);
              }
              auVar32._0_4_ = (-(uint)(fVar91 < (float)local_17f8._0_4_) & auVar48._0_4_) << 0x1f;
              auVar32._4_4_ = (-(uint)(fVar94 < (float)local_17f8._4_4_) & auVar48._4_4_) << 0x1f;
              auVar32._8_4_ = (-(uint)(fVar41 < fStack_17f0) & auVar48._8_4_) << 0x1f;
              auVar32._12_4_ = (-(uint)(fVar42 < fStack_17ec) & auVar48._12_4_) << 0x1f;
              uVar88 = movmskps((int)context,auVar32);
              context = (RayQueryContext *)(ulong)uVar88;
              if (uVar88 != 0) {
                aVar49.v = (__m128)blendvps(_DAT_01f45a30,auVar90,auVar32);
                auVar33._4_4_ = -(uint)(aVar49.v[1] < fVar44);
                auVar33._0_4_ = -(uint)(aVar49.v[0] < fVar43);
                auVar33._8_4_ = -(uint)(aVar49.v[2] < fVar45);
                auVar33._12_4_ = -(uint)(aVar49.v[3] < fVar46);
                iVar21 = movmskps(uVar88,auVar33);
                if (iVar21 == 0) {
                  aVar50.v[1] = fVar44;
                  aVar50.v[0] = fVar43;
                  aVar50.v[2] = fVar45;
                  aVar50.v[3] = fVar46;
                  pRVar25 = pRVar20;
                  aVar34 = aVar49;
LAB_006da2a5:
                  uVar19 = uVar19 + 1;
                  pNVar28->ptr = (size_t)pRVar26;
                  pNVar28 = pNVar28 + 1;
                  *paVar29 = aVar34;
                  paVar29 = paVar29 + 1;
                  context = pRVar26;
                  aVar49 = aVar50;
                }
                else {
                  aVar34.v[1] = fVar44;
                  aVar34.v[0] = fVar43;
                  aVar34.v[2] = fVar45;
                  aVar34.v[3] = fVar46;
                  pRVar25 = pRVar26;
                  pRVar26 = pRVar20;
                  context = pRVar20;
                  aVar50 = aVar49;
                  if (pRVar20 != (RayQueryContext *)0x8) goto LAB_006da2a5;
                }
                pRVar20 = pRVar25;
                fVar43 = aVar49.v[0];
                fVar44 = aVar49.v[1];
                fVar45 = aVar49.v[2];
                fVar46 = aVar49.v[3];
              }
            }
            if (pRVar20 == (RayQueryContext *)0x8) goto LAB_006da087;
            fVar91 = fVar43;
            fVar94 = fVar44;
            fVar41 = fVar45;
            fVar42 = fVar46;
            if (1 < uVar19) {
              auVar66 = *(undefined1 (*) [16])paVar29[-2].v;
              auVar35 = *(undefined1 (*) [16])paVar29[-1].v;
              auVar51._4_4_ = -(uint)(auVar66._4_4_ < auVar35._4_4_);
              auVar51._0_4_ = -(uint)(auVar66._0_4_ < auVar35._0_4_);
              auVar51._8_4_ = -(uint)(auVar66._8_4_ < auVar35._8_4_);
              auVar51._12_4_ = -(uint)(auVar66._12_4_ < auVar35._12_4_);
              uVar16 = movmskps(uVar16,auVar51);
              uVar22 = (ulong)uVar16;
              auVar82 = auVar35;
              if (uVar16 != 0) {
                *(undefined1 (*) [16])paVar29[-2].v = auVar35;
                *(undefined1 (*) [16])paVar29[-1].v = auVar66;
                auVar82 = *(undefined1 (*) [16])(pNVar28 + -2);
                auVar52._0_8_ = auVar82._8_8_;
                auVar52._8_4_ = auVar82._0_4_;
                auVar52._12_4_ = auVar82._4_4_;
                *(undefined1 (*) [16])(pNVar28 + -2) = auVar52;
                auVar82 = auVar66;
                auVar66 = auVar35;
              }
              if (uVar19 != 2) {
                auVar35 = *(undefined1 (*) [16])paVar29[-3].v;
                auVar58._4_4_ = -(uint)(auVar35._4_4_ < auVar82._4_4_);
                auVar58._0_4_ = -(uint)(auVar35._0_4_ < auVar82._0_4_);
                auVar58._8_4_ = -(uint)(auVar35._8_4_ < auVar82._8_4_);
                auVar58._12_4_ = -(uint)(auVar35._12_4_ < auVar82._12_4_);
                uVar16 = movmskps((int)uVar19,auVar58);
                uVar19 = (ulong)uVar16;
                if (uVar16 != 0) {
                  *(undefined1 (*) [16])paVar29[-3].v = auVar82;
                  *(undefined1 (*) [16])paVar29[-1].v = auVar35;
                  uVar19 = pNVar28[-3].ptr;
                  uVar22 = pNVar28[-1].ptr;
                  pNVar28[-3].ptr = uVar22;
                  pNVar28[-1].ptr = uVar19;
                  auVar35 = auVar82;
                }
                auVar40._4_4_ = -(uint)(auVar35._4_4_ < auVar66._4_4_);
                auVar40._0_4_ = -(uint)(auVar35._0_4_ < auVar66._0_4_);
                auVar40._8_4_ = -(uint)(auVar35._8_4_ < auVar66._8_4_);
                auVar40._12_4_ = -(uint)(auVar35._12_4_ < auVar66._12_4_);
                uVar16 = movmskps((int)uVar19,auVar40);
                uVar19 = (ulong)uVar16;
                if (uVar16 != 0) {
                  *(undefined1 (*) [16])paVar29[-3].v = auVar66;
                  *(undefined1 (*) [16])paVar29[-2].v = auVar35;
                  auVar66 = *(undefined1 (*) [16])(pNVar28 + -3);
                  auVar36._0_8_ = auVar66._8_8_;
                  auVar36._8_4_ = auVar66._0_4_;
                  auVar36._12_4_ = auVar66._4_4_;
                  *(undefined1 (*) [16])(pNVar28 + -3) = auVar36;
                }
              }
            }
          }
          if (pRVar20 == (RayQueryContext *)&DAT_fffffffffffffff8) {
            return;
          }
          auVar37._4_4_ = -(uint)(fVar94 < (float)local_17f8._4_4_);
          auVar37._0_4_ = -(uint)(fVar91 < (float)local_17f8._0_4_);
          auVar37._8_4_ = -(uint)(fVar41 < fStack_17f0);
          auVar37._12_4_ = -(uint)(fVar42 < fStack_17ec);
          uVar16 = movmskps((int)uVar19,auVar37);
          auVar117._4_4_ = 0;
          auVar117._0_4_ = uVar16;
          auVar117._8_8_ = uVar22;
          if (uVar16 != 0) {
            lVar23 = (ulong)((uint)pRVar20 & 0xf) - 8;
            auVar117._0_8_ = lVar23;
            for (lVar24 = 0; lVar23 != lVar24; lVar24 = lVar24 + 1) {
              local_1774 = *(uint *)(((ulong)pRVar20 & 0xfffffffffffffff0) + lVar24 * 8);
              local_1770 = *(long *)(*(long *)(*(long *)ray + 0x1e8) + (ulong)local_1774 * 8);
              uVar16 = *(uint *)(local_1770 + 0x34);
              auVar38._0_4_ = -(uint)((uVar16 & *(uint *)&(This->intersector8).occluded) == 0);
              auVar38._4_4_ =
                   -(uint)((uVar16 & *(uint *)((long)&(This->intersector8).occluded + 4)) == 0);
              auVar38._8_4_ = -(uint)((uVar16 & *(uint *)&(This->intersector8).name) == 0);
              auVar38._12_4_ =
                   -(uint)((uVar16 & *(uint *)((long)&(This->intersector8).name + 4)) == 0);
              mask.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)(~auVar38 & auVar37);
              iVar21 = movmskps(auVar117._8_4_,(undefined1  [16])mask.field_0);
              auVar117._8_4_ = iVar21;
              auVar117._0_8_ = local_1770;
              auVar117._12_4_ = 0;
              if (iVar21 != 0) {
                local_1790 = *(undefined4 *)(((ulong)pRVar20 & 0xfffffffffffffff0) + 4 + lVar24 * 8)
                ;
                local_17a0 = &mask;
                local_1798 = *(undefined8 *)(local_1770 + 0x18);
                local_1788 = *(undefined8 *)(ray + 8);
                local_1778 = 4;
                local_1768 = 0;
                local_1760 = *(long *)(ray + 0x10);
                pcVar17 = *(code **)(local_1760 + 0x18);
                if (pcVar17 == (code *)0x0) {
                  pcVar17 = *(code **)(local_1770 + 0x60);
                }
                local_1780 = This;
                auVar117 = (*pcVar17)(&local_17a0);
                fVar56 = local_1758;
                fVar59 = fStack_1754;
                fVar61 = fStack_1750;
                fVar63 = fStack_174c;
                fVar83 = local_1748;
                fVar86 = fStack_1744;
                fVar102 = fStack_1740;
                fVar103 = fStack_173c;
                fVar104 = local_1718;
                fVar106 = fStack_1714;
                fVar107 = fStack_1710;
                fVar108 = fStack_170c;
                fVar109 = local_1728;
                fVar110 = fStack_1724;
                fVar111 = fStack_1720;
                fVar112 = fStack_171c;
                fVar113 = local_1738;
                fVar114 = fStack_1734;
                fVar115 = fStack_1730;
                fVar116 = fStack_172c;
              }
            }
            _local_17f8 = blendvps(_local_17f8,
                                   *(undefined1 (*) [16])&(This->intersector4_nofilter).name,auVar37
                                  );
          }
        }
        goto LAB_006da087;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }